

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::accessChainLoad
          (TGlslangToSpvTraverser *this,TType *type)

{
  AccessChain *pAVar1;
  Id resultType;
  CoherentFlags CVar2;
  MemoryAccessMask MVar3;
  int iVar4;
  uint uVar5;
  Decoration precision;
  Decoration l_nonUniform;
  Decoration r_nonUniform;
  Scope scope;
  Id loadedId;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type_00;
  CoherentFlags coherentFlags;
  AccessChain local_88;
  
  resultType = spv::Builder::accessChainGetInferredType(&this->builder);
  pAVar1 = &(this->builder).accessChain;
  type_00 = (TType *)pAVar1;
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  coherentFlags = local_88.coherentFlags;
  spv::Builder::AccessChain::~AccessChain(&local_88);
  CVar2 = TranslateCoherent((TGlslangToSpvTraverser *)type,type_00);
  local_88.base._0_2_ = CVar2._0_2_;
  spv::Builder::AccessChain::CoherentFlags::operator|=(&coherentFlags,(CoherentFlags *)&local_88);
  MVar3 = TranslateMemoryAccess(this,&coherentFlags);
  MVar3 = MVar3 & ~MakePointerAvailable;
  iVar4 = (*type->_vptr_TType[0xb])(type);
  if (((*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0xff80) == 0x2400) &&
     (this->glslangIntermediate->useVulkanMemoryModel == true)) {
    MVar3 = MVar3 | 0x105ff < (this->glslangIntermediate->spvVersion).spv;
  }
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  spv::Builder::AccessChain::~AccessChain(&local_88);
  uVar5 = glslang::TType::getBufferReferenceAlignment(type);
  precision = TranslatePrecisionDecoration(type);
  spv::Builder::AccessChain::AccessChain(&local_88,pAVar1);
  l_nonUniform = TranslateNonUniformDecoration(this,&local_88.coherentFlags);
  iVar4 = (*type->_vptr_TType[0xb])(type);
  r_nonUniform = TranslateNonUniformDecoration(this,(TQualifier *)CONCAT44(extraout_var_00,iVar4));
  scope = TranslateMemoryScope(this,&coherentFlags);
  loadedId = spv::Builder::accessChainLoad
                       (&this->builder,precision,l_nonUniform,r_nonUniform,resultType,MVar3,scope,
                        uVar5 | local_88.alignment);
  spv::Builder::AccessChain::~AccessChain(&local_88);
  iVar4 = (*type->_vptr_TType[7])(type);
  if (iVar4 == 0xc) {
    loadedId = convertLoadedBoolInUniformToUint(this,type,resultType,loadedId);
  }
  return loadedId;
}

Assistant:

spv::Id TGlslangToSpvTraverser::accessChainLoad(const glslang::TType& type)
{
    spv::Id nominalTypeId = builder.accessChainGetInferredType();

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    spv::MemoryAccessMask accessMask = spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) & ~spv::MemoryAccessMakePointerAvailableKHRMask);
    // If the value being loaded is HelperInvocation, SPIR-V 1.6 is being generated (so that
    // SPV_EXT_demote_to_helper_invocation is in core) and the memory model is in use, add
    // the Volatile MemoryAccess semantic.
    if (type.getQualifier().builtIn == glslang::EbvHelperInvocation &&
        glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        accessMask = spv::MemoryAccessMask(accessMask | spv::MemoryAccessVolatileMask);
    }

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    spv::Id loadedId = builder.accessChainLoad(TranslatePrecisionDecoration(type),
        TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
        TranslateNonUniformDecoration(type.getQualifier()),
        nominalTypeId,
        accessMask,
        TranslateMemoryScope(coherentFlags),
        alignment);

    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        loadedId = convertLoadedBoolInUniformToUint(type, nominalTypeId, loadedId);
    }

    return loadedId;
}